

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::Limits::test_max_transform_feedback_separate_attribs(Limits *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  GLint max_transform_feedback_separate_attribs;
  int local_1a4;
  undefined1 local_1a0 [384];
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  local_1a4 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8c8b,&local_1a4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x8bb);
  iVar1 = local_1a4;
  if (local_1a4 < 4) {
    local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is equal to ");
    std::ostream::operator<<(this_00,local_1a4);
    std::operator<<((ostream *)this_00," which is less than expected ");
    this_01 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1a0,
                         &s_min_value_of_max_transform_feedback_separate_attribs);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return 3 < iVar1;
}

Assistant:

bool gl3cts::TransformFeedback::Limits::test_max_transform_feedback_separate_attribs(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check that MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is at least 4. */
	glw::GLint max_transform_feedback_separate_attribs = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &max_transform_feedback_separate_attribs);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_transform_feedback_separate_attribs < s_min_value_of_max_transform_feedback_separate_attribs)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is equal to "
			<< max_transform_feedback_separate_attribs << " which is less than expected "
			<< s_min_value_of_max_transform_feedback_separate_attribs << "." << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}